

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddFuncs.c
# Opt level: O2

int cuddZddGetCofactors2(DdManager *dd,DdNode *f,int v,DdNode **f1,DdNode **f0)

{
  DdNode *pDVar1;
  
  pDVar1 = cuddZddSubset1(dd,f,v);
  *f1 = pDVar1;
  if (pDVar1 != (DdNode *)0x0) {
    pDVar1 = cuddZddSubset0(dd,f,v);
    *f0 = pDVar1;
    if (pDVar1 != (DdNode *)0x0) {
      return 0;
    }
    Cudd_RecursiveDerefZdd(dd,*f1);
  }
  return 1;
}

Assistant:

int
cuddZddGetCofactors2(
  DdManager * dd,
  DdNode * f,
  int  v,
  DdNode ** f1,
  DdNode ** f0)
{
    *f1 = cuddZddSubset1(dd, f, v);
    if (*f1 == NULL)
        return(1);
    *f0 = cuddZddSubset0(dd, f, v);
    if (*f0 == NULL) {
        Cudd_RecursiveDerefZdd(dd, *f1);
        return(1);
    }
    return(0);

}